

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointgrid.cpp
# Opt level: O2

bool __thiscall ON_PointGrid::SetPoint(ON_PointGrid *this,int i,int j,ON_3dPoint *point)

{
  ON_3dPoint *pOVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  
  bVar3 = false;
  if ((((-1 < i) && (-1 < j)) && (i < this->m_point_count[0])) && (j < this->m_point_count[1])) {
    iVar4 = i * this->m_point_stride0 + j;
    pOVar1 = (this->m_point).super_ON_SimpleArray<ON_3dPoint>.m_a;
    pOVar1[iVar4].z = point->z;
    dVar2 = point->y;
    pOVar1 = pOVar1 + iVar4;
    pOVar1->x = point->x;
    pOVar1->y = dVar2;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool ON_PointGrid::SetPoint( int i, int j, const ON_3dPoint& point )
{
  bool rc = false;
  if ( 0 <= i && i < m_point_count[0] && 0 <= j && j < m_point_count[1] ) {
    m_point[i*m_point_stride0+j] = point;
    rc = true;
  }
  return rc;
}